

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

event * event_new(event_base *base,int fd,short events,_func_void_int_short_void_ptr *cb,void *arg)

{
  int iVar1;
  event *ev;
  void *arg_local;
  _func_void_int_short_void_ptr *cb_local;
  short events_local;
  int fd_local;
  event_base *base_local;
  
  base_local = (event_base *)event_mm_malloc_(0x80);
  if (base_local == (event_base *)0x0) {
    base_local = (event_base *)0x0;
  }
  else {
    iVar1 = event_assign((event *)base_local,base,fd,events,cb,arg);
    if (iVar1 < 0) {
      event_mm_free_(base_local);
      base_local = (event_base *)0x0;
    }
  }
  return (event *)base_local;
}

Assistant:

struct event *
event_new(struct event_base *base, evutil_socket_t fd, short events, void (*cb)(evutil_socket_t, short, void *), void *arg)
{
	struct event *ev;
	ev = mm_malloc(sizeof(struct event));
	if (ev == NULL)
		return (NULL);
	if (event_assign(ev, base, fd, events, cb, arg) < 0) {
		mm_free(ev);
		return (NULL);
	}

	return (ev);
}